

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O0

HitList<DNA> * __thiscall
Search<DNA>::Query(HitList<DNA> *__return_storage_ptr__,Search<DNA> *this,Sequence<DNA> *query)

{
  Sequence<DNA> *pSVar1;
  anon_class_8_1_898c8c3e local_148;
  function<void_(const_Sequence<DNA>_&,_const_Cigar_&)> local_140;
  Sequence<DNA> local_120;
  Sequence<DNA> local_c0;
  anon_class_8_1_898c8c3e local_50;
  function<void_(const_Sequence<DNA>_&,_const_Cigar_&)> local_48;
  Strand local_28;
  undefined1 local_21;
  Strand strand;
  Sequence<DNA> *query_local;
  Search<DNA> *this_local;
  HitList<DNA> *hits;
  
  local_21 = 0;
  _strand = query;
  query_local = (Sequence<DNA> *)this;
  this_local = (Search<DNA> *)__return_storage_ptr__;
  std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::deque(__return_storage_ptr__);
  pSVar1 = _strand;
  local_28 = this->mParams->strand;
  if ((local_28 == Plus) || (local_28 == Both)) {
    local_50.hits = __return_storage_ptr__;
    std::function<void(Sequence<DNA>const&,Cigar_const&)>::
    function<Search<DNA>::Query(Sequence<DNA>const&)::_lambda(Sequence<DNA>const&,Cigar_const&)_1_,void>
              ((function<void(Sequence<DNA>const&,Cigar_const&)> *)&local_48,&local_50);
    (**this->_vptr_Search)(this,pSVar1,&local_48);
    std::function<void_(const_Sequence<DNA>_&,_const_Cigar_&)>::~function(&local_48);
  }
  if ((local_28 == Minus) || (local_28 == Both)) {
    Sequence<DNA>::Reverse(&local_120,_strand);
    Sequence<DNA>::Complement(&local_c0,&local_120);
    local_148.hits = __return_storage_ptr__;
    std::function<void(Sequence<DNA>const&,Cigar_const&)>::
    function<Search<DNA>::Query(Sequence<DNA>const&)::_lambda(Sequence<DNA>const&,Cigar_const&)_2_,void>
              ((function<void(Sequence<DNA>const&,Cigar_const&)> *)&local_140,&local_148);
    (**this->_vptr_Search)(this,&local_c0,&local_140);
    std::function<void_(const_Sequence<DNA>_&,_const_Cigar_&)>::~function(&local_140);
    Sequence<DNA>::~Sequence(&local_c0);
    Sequence<DNA>::~Sequence(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

inline HitList< DNA > Search< DNA >::Query( const Sequence< DNA >& query ) {
  HitList< DNA > hits;

  auto strand = mParams.strand;

  if( strand == DNA::Strand::Plus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query, [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Plus } );
      } );
  }

  if( strand == DNA::Strand::Minus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query.Reverse().Complement(),
      [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Minus } );
      } );
  }

  return hits;
}